

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mars.cpp
# Opt level: O0

void __thiscall MARS::f_mix(MARS *this,uint *a,uint *b,uint *c,uint *d)

{
  uint uVar1;
  reference pvVar2;
  uint r;
  uint *d_local;
  uint *c_local;
  uint *b_local;
  uint *a_local;
  MARS *this_local;
  
  uVar1 = *a;
  pvVar2 = std::array<unsigned_int,_512UL>::operator[](&this->S,(ulong)(*a & 0xff));
  *b = *pvVar2 ^ *b;
  pvVar2 = std::array<unsigned_int,_512UL>::operator[]
                     (&this->S,(ulong)((uVar1 >> 8 & 0xff) + 0x100));
  *b = *pvVar2 + *b;
  uVar1 = *a;
  *a = *a >> 0x18 | *a << 8;
  pvVar2 = std::array<unsigned_int,_512UL>::operator[](&this->S,(ulong)(uVar1 >> 0x10 & 0xff));
  *c = *pvVar2 + *c;
  pvVar2 = std::array<unsigned_int,_512UL>::operator[](&this->S,(ulong)((*a & 0xff) + 0x100));
  *d = *pvVar2 ^ *d;
  return;
}

Assistant:

void MARS::f_mix(unsigned &a, unsigned &b, unsigned &c, unsigned &d) {
    unsigned r = rotr(a, 8);
    b ^= S[a & 255];
    b += S[(r & 255) + 256];
    r = rotr(a, 16);
    a = rotr(a, 24);
    c += S[r & 255];
    d ^= S[(a & 255) + 256];
}